

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  ID id;
  int iVar9;
  SPIRType *type_00;
  undefined8 *puVar10;
  long *plVar11;
  runtime_error *prVar12;
  size_type *psVar13;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  uint uVar17;
  uint32_t __val;
  SPIRType *pSVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar22;
  char (*ts_7) [2];
  BuiltIn builtin;
  undefined4 uStack_294;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string pack_pfx;
  uint local_254;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string __str_2;
  string array_type;
  string td_line;
  string __str_1;
  string __str;
  undefined1 local_180 [192];
  SmallVector<unsigned_int,_8UL> local_c0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  bVar6 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  if (bVar6) {
    member_type_id =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar6 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationInterfaceOrigID);
  id.id = 0;
  if (bVar6) {
    id.id = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
  bVar7 = false;
  if (bVar6) {
    bVar7 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationRowMajor);
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_003574a8;
  local_180._8_4_ = 0;
  local_180._12_4_ = 0;
  local_180._16_4_ = 0;
  local_180._20_4_ = 1;
  local_180._24_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_8_ = (ulong)(ushort)local_180._126_2_ << 0x30;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_88 = (ulong)local_88._4_4_ << 0x20;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_68._0_8_ = local_40 + 8;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if ((bVar6) ||
     (bVar6 = Compiler::has_extended_member_decoration
                        ((Compiler *)this,(type->super_IVariant).self.id,index,
                         SPIRVCrossDecorationResourceIndexPrimary), bVar6)) {
    this->is_using_builtin_array = true;
  }
  bVar6 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar18 = type_00;
  if (!bVar6) {
    if (bVar7 != false) {
      local_180._8_4_ = (type_00->super_IVariant).self.id;
      uVar21 = *(undefined8 *)&(type_00->super_IVariant).field_0xc;
      uVar2 = type_00->vecsize;
      uVar3 = type_00->columns;
      local_180._12_4_ = (undefined4)uVar21;
      local_180._16_4_ = (undefined4)((ulong)uVar21 >> 0x20);
      local_180._20_4_ = uVar2;
      local_180._24_4_ = uVar3;
      SmallVector<unsigned_int,_8UL>::operator=
                ((SmallVector<unsigned_int,_8UL> *)(local_180 + 0x20),&type_00->array);
      SmallVector<bool,_8UL>::operator=
                ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&type_00->array_size_literal);
      local_180._120_4_ = type_00->pointer_depth;
      local_180[0x7c] = type_00->pointer;
      local_180[0x7d] = type_00->forward_pointer;
      local_180._126_2_ = *(undefined2 *)&type_00->field_0x7e;
      local_180._128_4_ = type_00->storage;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_180 + 0x88)
                 ,&type_00->member_types);
      SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&type_00->member_type_index_redirection);
      local_88._0_4_ = (type_00->image).type;
      local_88._4_4_ = (type_00->image).dim;
      uStack_80._0_1_ = (type_00->image).depth;
      uStack_80._1_1_ = (type_00->image).arrayed;
      uStack_80._2_1_ = (type_00->image).ms;
      uStack_80._3_1_ = (type_00->image).field_0xb;
      uStack_80._4_4_ = (type_00->image).sampled;
      local_78._0_4_ = (type_00->image).format;
      local_78._4_4_ = (type_00->image).access;
      uStack_70._0_4_ = (type_00->type_alias).id;
      uStack_70._4_4_ = (type_00->parent_type).id;
      if (type_00 != (SPIRType *)local_180) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_68,&(type_00->member_name_cache)._M_h);
      }
      uVar4 = local_180._20_4_;
      local_180._20_4_ = local_180._24_4_;
      local_180._24_4_ = uVar4;
      pSVar18 = (SPIRType *)local_180;
    }
    goto LAB_002739c9;
  }
  if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&array_type,"Cannot emit a packed struct currently.","");
    ::std::runtime_error::runtime_error(prVar12,(string *)&array_type);
    *(undefined ***)prVar12 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
  if (!bVar6) {
    bVar6 = Compiler::is_scalar((Compiler *)this,type_00);
    if (!bVar6) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2e9724);
    }
    goto LAB_002739c9;
  }
  __val = type_00->vecsize;
  local_254 = type_00->columns;
  ::std::__cxx11::string::_M_replace((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2e9724);
  if (bVar7 != false) {
    local_254 = type_00->vecsize;
    __val = type_00->columns;
    ::std::__cxx11::string::_M_replace
              ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x2f15e8);
  }
  bVar6 = type_00->width == 0x10;
  pcVar19 = "float";
  if (bVar6) {
    pcVar19 = "half";
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&array_type,pcVar19,pcVar19 + ((ulong)bVar6 ^ 5));
  td_line._M_dataplus._M_p = (pointer)&td_line.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&td_line,"typedef ","");
  ::std::operator+(&local_250,"packed_",&array_type);
  cVar8 = '\x01';
  if (9 < __val) {
    uVar20 = (ulong)__val;
    cVar5 = '\x04';
    do {
      cVar8 = cVar5;
      uVar16 = (uint)uVar20;
      if (uVar16 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00273383;
      }
      if (uVar16 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00273383;
      }
      if (uVar16 < 10000) goto LAB_00273383;
      uVar20 = uVar20 / 10000;
      cVar5 = cVar8 + '\x04';
    } while (99999 < uVar16);
    cVar8 = cVar8 + '\x01';
  }
LAB_00273383:
  paVar1 = &__str_2.field_2;
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,__val);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    uVar21 = local_250.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < __str_2._M_string_length + local_250._M_string_length) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_2._M_dataplus._M_p != paVar1) {
      uVar21 = __str_2.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < __str_2._M_string_length + local_250._M_string_length) goto LAB_002733f9;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&__str_2,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
  }
  else {
LAB_002733f9:
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::_M_append((char *)&local_250,(ulong)__str_2._M_dataplus._M_p);
  }
  _builtin = (pointer)&local_288;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar15) {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_288._8_8_ = puVar10[3];
  }
  else {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    _builtin = (pointer)*puVar10;
  }
  local_290 = puVar10[1];
  *puVar10 = paVar15;
  puVar10[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin," "
                   ,&pack_pfx);
  ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  uVar16 = type_00->columns;
  cVar8 = '\x01';
  if (9 < uVar16) {
    uVar17 = uVar16;
    cVar5 = '\x04';
    do {
      cVar8 = cVar5;
      if (uVar17 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00273537;
      }
      if (uVar17 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00273537;
      }
      if (uVar17 < 10000) goto LAB_00273537;
      bVar6 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar5 = cVar8 + '\x04';
    } while (bVar6);
    cVar8 = cVar8 + '\x01';
  }
LAB_00273537:
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&__str,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar16);
  plVar11 = (long *)::std::__cxx11::string::replace
                              ((ulong)&__str,0,(char *)0x0,(ulong)array_type._M_dataplus._M_p);
  __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
  psVar13 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar13) {
    __str_2.field_2._M_allocated_capacity = *psVar13;
    __str_2.field_2._8_8_ = plVar11[3];
  }
  else {
    __str_2.field_2._M_allocated_capacity = *psVar13;
    __str_2._M_dataplus._M_p = (pointer)*plVar11;
  }
  __str_2._M_string_length = plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)::std::__cxx11::string::append((char *)&__str_2);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  puVar14 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_250.field_2._M_allocated_capacity = *puVar14;
    local_250.field_2._8_8_ = plVar11[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar14;
    local_250._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_250._M_string_length = plVar11[1];
  *plVar11 = (long)puVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar16 = type_00->vecsize;
  cVar8 = '\x01';
  if (9 < uVar16) {
    uVar17 = uVar16;
    cVar5 = '\x04';
    do {
      cVar8 = cVar5;
      if (uVar17 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0027367f;
      }
      if (uVar17 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0027367f;
      }
      if (uVar17 < 10000) goto LAB_0027367f;
      bVar6 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar5 = cVar8 + '\x04';
    } while (bVar6);
    cVar8 = cVar8 + '\x01';
  }
LAB_0027367f:
  paVar1 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar16);
  uVar20 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
           local_250._M_string_length;
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    uVar21 = local_250.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < uVar20) {
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      uVar21 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < uVar20) goto LAB_00273705;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&__str_1,0,(char *)0x0,(ulong)local_250._M_dataplus._M_p);
  }
  else {
LAB_00273705:
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::_M_append((char *)&local_250,(ulong)__str_1._M_dataplus._M_p);
  }
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar15) {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_288._8_8_ = puVar10[3];
    _builtin = (pointer)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    _builtin = (pointer)*puVar10;
  }
  local_290 = puVar10[1];
  *puVar10 = paVar15;
  puVar10[1] = 0;
  paVar15->_M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar1) {
    operator_delete(__str_1._M_dataplus._M_p);
  }
  paVar1 = &__str_2.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  cVar8 = '\x01';
  if (9 < local_254) {
    uVar16 = local_254;
    cVar5 = '\x04';
    do {
      cVar8 = cVar5;
      if (uVar16 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00273836;
      }
      if (uVar16 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00273836;
      }
      if (uVar16 < 10000) goto LAB_00273836;
      bVar6 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar8 + '\x04';
    } while (bVar6);
    cVar8 = cVar8 + '\x01';
  }
LAB_00273836:
  __str_2._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar8);
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,local_254);
  plVar11 = (long *)::std::__cxx11::string::replace((ulong)&__str_2,0,(char *)0x0,0x2f169e);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  puVar14 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_250.field_2._M_allocated_capacity = *puVar14;
    local_250.field_2._8_8_ = plVar11[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar14;
    local_250._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_250._M_string_length = plVar11[1];
  *plVar11 = (long)puVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)::std::__cxx11::string::append((char *)&local_250);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar15) {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_288._8_8_ = plVar11[3];
    _builtin = (pointer)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar15->_M_allocated_capacity;
    _builtin = (pointer)*plVar11;
  }
  local_290 = plVar11[1];
  *plVar11 = (long)paVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&td_line);
  pVar22 = ::std::
           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
           ::_M_insert_unique<std::__cxx11::string_const&>
                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&this->typedef_lines,&td_line);
  if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    Compiler::force_recompile((Compiler *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != &array_type.field_2) {
    operator_delete(array_type._M_dataplus._M_p);
  }
LAB_002739c9:
  iVar9 = *(int *)&(type_00->super_IVariant).field_0xc;
  if ((((this->msl_options).platform == iOS) && (iVar9 == 0x10)) && ((type_00->image).sampled == 2))
  {
    bVar6 = Compiler::has_decoration((Compiler *)this,id,DecorationNonWritable);
    if (!bVar6) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,"Writable images are not allowed in argument buffers on iOS."
                 ,"");
      ::std::runtime_error::runtime_error(prVar12,(string *)&array_type);
      *(undefined ***)prVar12 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar9 = *(int *)&(type_00->super_IVariant).field_0xc;
  }
  paVar1 = &array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  array_type._M_dataplus._M_p = (pointer)paVar1;
  if (2 < iVar9 - 0x10U) {
    builtin = 0x7fffffff;
    bVar6 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
    if (bVar6) {
      this->is_using_builtin_array = true;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&td_line,this,type_00);
    ::std::__cxx11::string::operator=((string *)&array_type,(string *)&td_line);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)td_line._M_dataplus._M_p != &td_line.field_2) {
      operator_delete(td_line._M_dataplus._M_p);
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
            (&td_line,this,pSVar18,(ulong)id.id);
  CompilerGLSL::to_member_name_abi_cxx11_((string *)&builtin,&this->super_CompilerGLSL,type,index);
  ts_7 = (char (*) [2])0x273ad8;
  member_attribute_qualifier_abi_cxx11_(&local_250,this,type,index);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&pack_pfx,&td_line,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
             (char (*) [2])qualifier,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin,
             &local_250,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d9bde,ts_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != paVar1) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  local_180._0_8_ = &PTR__SPIRType_003574a8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (row_major)
	{
		// Need to declare type with flipped vecsize/columns.
		row_major_physical_type = physical_type;
		swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
		declared_type = &row_major_physical_type;
	}

	// Very specifically, image load-store in argument buffers are disallowed on MSL on iOS.
	if (msl_options.is_ios() && physical_type.basetype == SPIRType::Image && physical_type.image.sampled == 2)
	{
		if (!has_decoration(orig_id, DecorationNonWritable))
			SPIRV_CROSS_THROW("Writable images are not allowed in argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;
		if (is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id), " ", qualifier, to_member_name(type, index),
	                   member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}